

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void higan::Logger::SetLogToFile(string *log_dir,string *log_prefix,bool thread_safe)

{
  __shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar4;
  undefined1 local_48 [16];
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  undefined1 local_1a;
  bool local_19 [8];
  bool thread_safe_local;
  
  local_48._0_8_ = (element_type *)0x0;
  local_19[0] = thread_safe;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<higan::LogFile,std::allocator<higan::LogFile>,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),(LogFile **)local_48,
             (allocator<higan::LogFile> *)&local_1a,log_dir,log_prefix,local_19);
  _Var1._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
  _Var1._M_ptr = (element_type *)local_48._0_8_;
  local_48._0_8_ = (LogFile *)0x0;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var3._M_pi = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  bVar4 = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2> = _Var1;
  if (bVar4) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  peVar2 = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var3._M_pi = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_38 = (_Manager_type)0x0;
  p_Stack_30 = (_Invoker_type)0x0;
  local_48._0_8_ = (LogFile *)0x0;
  local_48._8_8_ = 0;
  local_48._0_8_ = operator_new(0x20);
  (((LogFile *)local_48._0_8_)->mutex_)._M_t.
  super___uniq_ptr_impl<higan::Mutex,_std::default_delete<higan::Mutex>_>._M_t.
  super__Tuple_impl<0UL,_higan::Mutex_*,_std::default_delete<higan::Mutex>_>.
  super__Head_base<0UL,_higan::Mutex_*,_false>._M_head_impl = (Mutex *)LogFile::Append;
  (((LogFile *)local_48._0_8_)->log_dir_)._M_dataplus._M_p = (pointer)0x0;
  (((LogFile *)local_48._0_8_)->log_dir_)._M_string_length = (size_type)peVar2;
  (((LogFile *)local_48._0_8_)->log_dir_).field_2._M_allocated_capacity = (size_type)_Var3._M_pi;
  p_Stack_30 = std::
               _Function_handler<void_(const_char_*,_unsigned_long),_std::_Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_char_*,_unsigned_long)>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_char_*,_unsigned_long),_std::_Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_char_*,_unsigned_long)>_>
             ::_M_manager;
  std::function<void_(const_char_*,_unsigned_long)>::operator=
            (&g_output_func,(function<void_(const_char_*,_unsigned_long)> *)local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)((_Any_data *)local_48,(_Any_data *)local_48,__destroy_functor);
  }
  peVar2 = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var3._M_pi = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_38 = (_Manager_type)0x0;
  p_Stack_30 = (_Invoker_type)0x0;
  local_48._0_8_ = (LogFile *)0x0;
  local_48._8_8_ = 0;
  local_48._0_8_ = operator_new(0x20);
  (((LogFile *)local_48._0_8_)->mutex_)._M_t.
  super___uniq_ptr_impl<higan::Mutex,_std::default_delete<higan::Mutex>_>._M_t.
  super__Tuple_impl<0UL,_higan::Mutex_*,_std::default_delete<higan::Mutex>_>.
  super__Head_base<0UL,_higan::Mutex_*,_false>._M_head_impl = (Mutex *)LogFile::Flush;
  (((LogFile *)local_48._0_8_)->log_dir_)._M_dataplus._M_p = (pointer)0x0;
  (((LogFile *)local_48._0_8_)->log_dir_)._M_string_length = (size_type)peVar2;
  (((LogFile *)local_48._0_8_)->log_dir_).field_2._M_allocated_capacity = (size_type)_Var3._M_pi;
  p_Stack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()>_>
             ::_M_manager;
  std::function<void_()>::operator=(&g_flush_func,(function<void_()> *)local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)((_Any_data *)local_48,(_Any_data *)local_48,__destroy_functor);
  }
  return;
}

Assistant:

void Logger::SetLogToFile(const std::string& log_dir, const std::string& log_prefix, bool thread_safe)
{
	g_log_file = std::make_shared<LogFile>(log_dir, log_prefix, thread_safe);
	SetOutputFunction(std::bind(&LogFile::Append, g_log_file,
			std::placeholders::_1, std::placeholders::_2));
	SetFlushFunction(std::bind(&LogFile::Flush, g_log_file));
}